

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O2

void MapOptHandler_nocoloredspritelighting(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FGLROptions *pFVar2;
  bool bVar3;
  FName local_1c;
  
  FName::FName(&local_1c,"gl_renderer");
  pFVar2 = level_info_t::GetOptData<FGLROptions>(info,&local_1c,true);
  bVar1 = FMapInfoParser::CheckAssign(parse);
  bVar3 = true;
  if (bVar1) {
    FScanner::MustGetNumber(&parse->sc);
    bVar3 = (parse->sc).Number != 0;
  }
  pFVar2->nocoloredspritelighting = bVar3;
  return;
}

Assistant:

DEFINE_MAP_OPTION(nocoloredspritelighting, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");
	if (parse.CheckAssign())
	{
		parse.sc.MustGetNumber();
		opt->nocoloredspritelighting = !!parse.sc.Number;
	}
	else
	{
		opt->nocoloredspritelighting = true;
	}
}